

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O1

vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
* __thiscall
fasttext::Meter::getPositiveCounts
          (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *__return_storage_ptr__,Meter *this,int32_t labelId)

{
  float fVar1;
  pointer ppVar2;
  float fVar3;
  uint64_t falsePositives;
  uint64_t truePositives;
  unsigned_long local_48;
  unsigned_long local_40;
  vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scoreVsTrue(&local_38,this,labelId);
  local_40 = 0;
  local_48 = 0;
  fVar3 = -2.0;
  do {
    if (local_38.
        super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_38.
        super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
        _M_impl.super__Vector_impl_data._M_start) break;
    fVar1 = local_38.
            super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1].first;
    if (0.0 <= fVar1) {
      if ((local_38.
           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1].second != 1.0) ||
         (NAN(local_38.
              super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].second))) {
        local_48 = local_48 + 1;
      }
      else {
        local_40 = local_40 + 1;
      }
      if (((fVar3 != fVar1) || (NAN(fVar3) || NAN(fVar1))) ||
         (ppVar2 = (__return_storage_ptr__->
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
         ppVar2 == (__return_storage_ptr__->
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)) {
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)__return_storage_ptr__,&local_40,&local_48);
        fVar3 = fVar1;
      }
      else {
        ppVar2[-1].first = local_40;
        ppVar2[-1].second = local_48;
        fVar3 = fVar1;
      }
    }
    local_38.super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_38.
         super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
  } while (0.0 <= fVar1);
  if (local_38.
      super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<uint64_t, uint64_t>> Meter::getPositiveCounts(
    int32_t labelId) const {
  std::vector<std::pair<uint64_t, uint64_t>> positiveCounts;

  const auto& v = scoreVsTrue(labelId);
  uint64_t truePositives = 0;
  uint64_t falsePositives = 0;
  double lastScore = falseNegativeScore - 1.0;

  for (auto it = v.rbegin(); it != v.rend(); ++it) {
    double score = it->first;
    double gold = it->second;
    if (score < 0) { // only reachable recall
      break;
    }
    if (gold == 1.0) {
      truePositives++;
    } else {
      falsePositives++;
    }
    if (score == lastScore && positiveCounts.size()) { // squeeze tied scores
      positiveCounts.back() = {truePositives, falsePositives};
    } else {
      positiveCounts.emplace_back(truePositives, falsePositives);
    }
    lastScore = score;
  }

  return positiveCounts;
}